

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O0

void mon_to_stone(monst *mtmp)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  monst *mtmp_local;
  
  if (mtmp->data->mlet != '7') {
    pcVar3 = a_monnam(mtmp);
    impossible("Can\'t polystone %s!",pcVar3);
    return;
  }
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_0024728d;
    if ((((u.uprops[0x1e].intrinsic == 0) &&
         (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
          (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
        ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
       (((u.uprops[0x40].intrinsic != 0 ||
         ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
        ((mtmp->data->mflags3 & 0x200) != 0)))) {
      bVar1 = viz_array[mtmp->my][mtmp->mx] & 1;
      goto joined_r0x00247287;
    }
  }
  else {
    bVar1 = worm_known(level,mtmp);
joined_r0x00247287:
    if (bVar1 != 0) {
LAB_0024728d:
      if (((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
            (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
          (((*(uint *)&mtmp->field_0x60 >> 7 & 1) == 0 &&
           ((*(uint *)&mtmp->field_0x60 >> 9 & 1) == 0)))) && (((byte)u._1052_1_ >> 5 & 1) == 0)) {
        pcVar3 = Monnam(mtmp);
        pline("%s solidifies...",pcVar3);
      }
    }
  }
  iVar2 = newcham(level,mtmp,mons + 0x108,'\0','\0');
  if (iVar2 == 0) {
    if (mtmp->wormno == '\0') {
      if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_002476cc;
      if (((u.uprops[0x1e].intrinsic != 0) || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed))))
         || (((youmonst.data)->mflags1 & 0x1000) != 0)) {
        if (ublindf == (obj *)0x0) {
          return;
        }
        if (ublindf->oartifact != '\x1d') {
          return;
        }
      }
      if (((u.uprops[0x40].intrinsic == 0) && (u.uprops[0x40].extrinsic == 0)) &&
         (((youmonst.data)->mflags3 & 0x100) == 0)) {
        return;
      }
      if ((mtmp->data->mflags3 & 0x200) == 0) {
        return;
      }
      bVar1 = viz_array[mtmp->my][mtmp->mx] & 1;
    }
    else {
      bVar1 = worm_known(level,mtmp);
    }
    if (bVar1 == 0) {
      return;
    }
LAB_002476cc:
    if ((((*(uint *)&mtmp->field_0x60 >> 1 & 1) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
       ((u.uprops[0xc].extrinsic == 0 && (((youmonst.data)->mflags1 & 0x1000000) == 0)))) {
      return;
    }
    if ((*(uint *)&mtmp->field_0x60 >> 7 & 1) != 0) {
      return;
    }
    if ((*(uint *)&mtmp->field_0x60 >> 9 & 1) != 0) {
      return;
    }
    if (((byte)u._1052_1_ >> 5 & 1) != 0) {
      return;
    }
    pline("... and returns to normal.");
    return;
  }
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_002474bc;
    if (((u.uprops[0x1e].intrinsic != 0) || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))) ||
       (((youmonst.data)->mflags1 & 0x1000) != 0)) {
      if (ublindf == (obj *)0x0) {
        return;
      }
      if (ublindf->oartifact != '\x1d') {
        return;
      }
    }
    if (((u.uprops[0x40].intrinsic == 0) && (u.uprops[0x40].extrinsic == 0)) &&
       (((youmonst.data)->mflags3 & 0x100) == 0)) {
      return;
    }
    if ((mtmp->data->mflags3 & 0x200) == 0) {
      return;
    }
    bVar1 = viz_array[mtmp->my][mtmp->mx] & 1;
  }
  else {
    bVar1 = worm_known(level,mtmp);
  }
  if (bVar1 == 0) {
    return;
  }
LAB_002474bc:
  if (((((*(uint *)&mtmp->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
      ((u.uprops[0xc].extrinsic != 0 || (((youmonst.data)->mflags1 & 0x1000000) != 0)))) &&
     ((((*(uint *)&mtmp->field_0x60 >> 7 & 1) == 0 && ((*(uint *)&mtmp->field_0x60 >> 9 & 1) == 0))
      && (((byte)u._1052_1_ >> 5 & 1) == 0)))) {
    pcVar3 = mons_mname(mtmp->data);
    pcVar3 = an(pcVar3);
    pline("Now it\'s %s.",pcVar3);
  }
  return;
}

Assistant:

void mon_to_stone(struct monst *mtmp)
{
    if (mtmp->data->mlet == S_GOLEM) {
	/* it's a golem, and not a stone golem */
	if (canseemon(level, mtmp))
	    pline("%s solidifies...", Monnam(mtmp));
	if (newcham(level, mtmp, &mons[PM_STONE_GOLEM], FALSE, FALSE)) {
	    if (canseemon(level, mtmp))
		pline("Now it's %s.", an(mons_mname(mtmp->data)));
	} else {
	    if (canseemon(level, mtmp))
		pline("... and returns to normal.");
	}
    } else
	impossible("Can't polystone %s!", a_monnam(mtmp));
}